

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CallExpression *call_expression)

{
  ostream *poVar1;
  
  PrintTabs(this);
  poVar1 = std::operator<<((ostream *)&this->stream_,"CallExpression: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  this->num_tabs_ = this->num_tabs_ + 1;
  (*(call_expression->function_name_->super_BaseElement)._vptr_BaseElement[2])
            (call_expression->function_name_,this);
  (*(call_expression->args_->super_BaseElement)._vptr_BaseElement[2])(call_expression->args_,this);
  this->num_tabs_ = this->num_tabs_ + -1;
  return;
}

Assistant:

void PrintVisitor::Visit(CallExpression *call_expression) {
  PrintTabs();
  stream_ << "CallExpression: " << std::endl;
  ++num_tabs_;
  call_expression->function_name_->Accept(this);
  call_expression->args_->Accept(this);
  --num_tabs_;
}